

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                 size_t *offsetPtr,U32 mls,U32 extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  BYTE *pBVar11;
  ulong uVar12;
  BYTE *pBVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  uint uVar18;
  uint *puVar19;
  uint uVar20;
  ulong *puVar21;
  ulong *puVar22;
  uint uVar23;
  long lVar24;
  U32 *pUVar25;
  uint uVar26;
  byte *pbVar27;
  ulong *puVar28;
  ulong *puVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  byte *pbVar34;
  BYTE *pBVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  ulong *puVar40;
  bool bVar41;
  BYTE *pInLoopLimit;
  U32 dummy32_1;
  U32 dummy32;
  U32 *bt;
  uint *local_130;
  byte *local_120;
  uint *local_118;
  uint *local_110;
  byte *local_108;
  ulong local_e0;
  uint local_90;
  uint local_8c;
  ulong *local_88;
  ZSTD_compressionParameters *local_80;
  U32 *local_78;
  BYTE *local_70;
  ulong local_68;
  U32 *local_60;
  BYTE *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_60 = ms->hashTable;
  cVar17 = (char)cParams->hashLog;
  switch(mls) {
  case 5:
    lVar24 = -0x30e4432345000000;
    break;
  case 6:
    lVar24 = -0x30e4432340650000;
    break;
  case 7:
    lVar24 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar24 = -0x30e44323485a9b9d;
    break;
  default:
    local_68 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar17 & 0x1fU));
    goto LAB_0019defb;
  }
  local_68 = (ulong)(lVar24 * *(long *)ip) >> (-cVar17 & 0x3fU);
LAB_0019defb:
  pBVar35 = (ms->window).base;
  uVar30 = (int)ip - (int)pBVar35;
  uVar2 = (ms->window).lowLimit;
  uVar33 = ~(-1 << ((char)cParams->chainLog - 1U & 0x1f));
  uVar18 = uVar30 - uVar33;
  if (uVar30 < uVar33) {
    uVar18 = 0;
  }
  uVar23 = uVar2;
  if (uVar2 < uVar18) {
    uVar23 = uVar18;
  }
  uVar31 = 1 << ((byte)cParams->searchLog & 0x1f);
  pUVar25 = ms->chainTable;
  uVar26 = local_60[local_68];
  uVar14 = 0;
  uVar36 = uVar31;
  if (uVar23 < uVar26) {
    uVar8 = 0;
    do {
      uVar14 = (ulong)uVar26;
      uVar12 = (ulong)((uVar26 & uVar33) * 2);
      if ((pUVar25[uVar12 + 1] != 1) || (uVar36 < 2)) {
        uVar14 = uVar8;
        if (pUVar25[uVar12 + 1] == 1) {
          (pUVar25 + uVar12)[0] = 0;
          (pUVar25 + uVar12)[1] = 0;
        }
        break;
      }
      pUVar25[uVar12 + 1] = (U32)uVar8;
      uVar36 = uVar36 - 1;
      uVar26 = pUVar25[uVar12];
      uVar8 = uVar14;
    } while (uVar23 < uVar26);
  }
  local_88 = offsetPtr;
  local_80 = cParams;
  local_78 = pUVar25;
  local_70 = pBVar35;
  if ((int)uVar14 != 0) {
    pBVar5 = (ms->window).dictBase;
    do {
      uVar38 = (uint)uVar14;
      uVar26 = pUVar25[(ulong)((uVar38 & uVar33) * 2) + 1];
      uVar20 = ~(-1 << ((char)local_80->chainLog - 1U & 0x1f));
      uVar3 = (ms->window).dictLimit;
      pbVar27 = (byte *)(ulong)uVar3;
      local_48 = (ulong *)(pBVar5 + (long)pbVar27);
      puVar40 = (ulong *)iend;
      pBVar13 = pBVar35;
      if (uVar38 < uVar3) {
        puVar40 = local_48;
        pBVar13 = pBVar5;
      }
      local_58 = pBVar35 + (long)pbVar27;
      uVar8 = (ulong)((uVar38 & uVar20) * 2);
      local_130 = pUVar25 + uVar8;
      local_118 = pUVar25 + uVar8 + 1;
      uVar32 = local_118[-1];
      uVar4 = (ms->window).lowLimit;
      puVar22 = (ulong *)((long)puVar40 - 7);
      local_38 = (ulong *)((long)puVar40 + -3);
      local_40 = (ulong *)((long)puVar40 + -1);
      local_120 = (byte *)0x0;
      local_108 = (byte *)0x0;
      uVar37 = uVar36;
      local_50 = puVar40;
      do {
        bVar41 = uVar37 == 0;
        uVar37 = uVar37 - 1;
        if ((bVar41) || (uVar32 <= uVar4)) break;
        pbVar10 = local_120;
        if (local_108 < local_120) {
          pbVar10 = local_108;
        }
        pBVar11 = pBVar35;
        if (extDict == 0) {
LAB_0019e1a7:
          puVar29 = (ulong *)(pBVar13 + (long)(pbVar10 + uVar14));
          puVar21 = (ulong *)(pBVar11 + uVar32 + (long)pbVar10);
          puVar28 = puVar29;
          if (puVar29 < puVar22) {
            uVar12 = *puVar29 ^ *puVar21;
            uVar8 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pbVar34 = (byte *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar21 == *puVar29) {
              do {
                puVar28 = puVar28 + 1;
                puVar21 = puVar21 + 1;
                if (puVar22 <= puVar28) goto LAB_0019e21b;
                uVar12 = *puVar28 ^ *puVar21;
                uVar8 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pbVar34 = (byte *)((long)puVar28 + ((uVar8 >> 3 & 0x1fffffff) - (long)puVar29));
              } while (*puVar21 == *puVar28);
            }
          }
          else {
LAB_0019e21b:
            if ((puVar28 < local_38) && ((int)*puVar21 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar28 < local_40) && ((short)*puVar21 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar28 < puVar40) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((byte)*puVar21 == (byte)*puVar28));
            }
            pbVar34 = (byte *)((long)puVar28 - (long)puVar29);
          }
          pbVar10 = pbVar34 + (long)pbVar10;
          pBVar11 = pBVar11 + uVar32;
        }
        else {
          if ((uVar38 < uVar3) || (pbVar27 <= pbVar10 + uVar32)) {
            if (pbVar10 + uVar32 < pbVar27) {
              pBVar11 = pBVar5;
            }
            goto LAB_0019e1a7;
          }
          sVar9 = ZSTD_count_2segments
                            (pBVar13 + (long)(pbVar10 + uVar14),pBVar5 + uVar32 + (long)pbVar10,
                             (BYTE *)puVar40,(BYTE *)local_48,local_58);
          pbVar10 = pbVar10 + sVar9;
          pUVar25 = local_78;
          pBVar35 = local_70;
          pBVar11 = local_70 + uVar32;
          puVar40 = local_50;
          if (pbVar10 + uVar32 < pbVar27) {
            pBVar11 = pBVar5 + uVar32;
          }
        }
        if ((ulong *)(pBVar13 + (long)(pbVar10 + uVar14)) == puVar40) {
          bVar41 = false;
        }
        else {
          puVar19 = pUVar25 + (uVar32 & uVar20) * 2;
          if (pBVar11[(long)pbVar10] < (byte)*(ulong *)(pBVar13 + (long)(pbVar10 + uVar14))) {
            *local_130 = uVar32;
            local_108 = pbVar10;
            if (uVar23 < uVar32) {
              puVar19 = puVar19 + 1;
              local_130 = puVar19;
LAB_0019e2cc:
              uVar32 = *puVar19;
              bVar41 = true;
            }
            else {
              bVar41 = false;
              local_130 = &local_8c;
            }
          }
          else {
            *local_118 = uVar32;
            local_120 = pbVar10;
            local_118 = puVar19;
            if (uVar23 < uVar32) goto LAB_0019e2cc;
            bVar41 = false;
            local_118 = &local_8c;
          }
        }
      } while (bVar41);
      *local_118 = 0;
      *local_130 = 0;
      uVar36 = uVar36 + 1;
      uVar14 = (ulong)uVar26;
    } while (uVar26 != 0);
  }
  pBVar5 = (ms->window).dictBase;
  uVar8 = (ulong)(ms->window).dictLimit;
  pBVar13 = pBVar35 + uVar8;
  uVar14 = (ulong)((uVar33 & uVar30) * 2);
  local_110 = pUVar25 + uVar14;
  local_130 = pUVar25 + uVar14 + 1;
  iVar39 = uVar30 + 9;
  uVar12 = (ulong)local_60[local_68];
  local_60[local_68] = uVar30;
  local_e0 = 0;
  local_120 = (byte *)0x0;
  uVar14 = 0;
  do {
    bVar41 = uVar31 == 0;
    uVar31 = uVar31 - 1;
    if ((bVar41) || (uVar23 = (uint)uVar12, uVar23 <= uVar2)) break;
    pbVar27 = local_120;
    if (local_e0 < local_120) {
      pbVar27 = (byte *)local_e0;
    }
    if ((extDict == 0) || (uVar8 <= (long)pbVar27 + uVar12)) {
      puVar40 = (ulong *)(ip + (long)pbVar27);
      puVar22 = (ulong *)(pBVar35 + uVar12 + (long)pbVar27);
      puVar29 = puVar40;
      if (puVar40 < iend + -7) {
        uVar16 = *puVar40 ^ *puVar22;
        uVar15 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = uVar15 >> 3 & 0x1fffffff;
        if (*puVar22 == *puVar40) {
          do {
            puVar29 = puVar29 + 1;
            puVar22 = puVar22 + 1;
            if (iend + -7 <= puVar29) goto LAB_0019e4fb;
            uVar16 = *puVar29 ^ *puVar22;
            uVar15 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (long)puVar29 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar40);
          } while (*puVar22 == *puVar29);
        }
      }
      else {
LAB_0019e4fb:
        if ((puVar29 < iend + -3) && ((int)*puVar22 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar22 = (ulong *)((long)puVar22 + 4);
        }
        if ((puVar29 < iend + -1) && ((short)*puVar22 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar22 = (ulong *)((long)puVar22 + 2);
        }
        if (puVar29 < iend) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar22 == (char)*puVar29));
        }
        uVar15 = (long)puVar29 - (long)puVar40;
      }
      uVar15 = uVar15 + (long)pbVar27;
      pBVar11 = pBVar35 + uVar12;
    }
    else {
      pBVar1 = pBVar5 + uVar12;
      sVar9 = ZSTD_count_2segments
                        (ip + (long)pbVar27,pBVar1 + (long)pbVar27,iend,pBVar5 + uVar8,pBVar13);
      uVar15 = sVar9 + (long)pbVar27;
      pUVar25 = local_78;
      pBVar35 = local_70;
      pBVar11 = local_70 + uVar12;
      if (uVar15 + uVar12 < uVar8) {
        pBVar11 = pBVar1;
      }
    }
    if (uVar14 < uVar15) {
      iVar7 = uVar23 + (int)uVar15;
      if (uVar15 <= iVar39 - uVar23) {
        iVar7 = iVar39;
      }
      uVar26 = (uVar30 + 1) - uVar23;
      iVar39 = 0x1f;
      if (uVar26 != 0) {
        for (; uVar26 >> iVar39 == 0; iVar39 = iVar39 + -1) {
        }
      }
      uVar26 = (int)*local_88 + 1;
      iVar6 = 0x1f;
      if (uVar26 != 0) {
        for (; uVar26 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      if (iVar39 - iVar6 < ((int)uVar15 - (int)uVar14) * 4) {
        *local_88 = (ulong)((uVar30 + 2) - uVar23);
        uVar14 = uVar15;
      }
      iVar39 = iVar7;
      if (ip + uVar15 != iend) goto LAB_0019e5b8;
      bVar41 = false;
    }
    else {
LAB_0019e5b8:
      puVar19 = pUVar25 + (uVar23 & uVar33) * 2;
      if (pBVar11[uVar15] < ip[uVar15]) {
        *local_110 = uVar23;
        local_e0 = uVar15;
        if (uVar18 < uVar23) {
          puVar19 = puVar19 + 1;
          local_110 = puVar19;
LAB_0019e611:
          uVar12 = (ulong)*puVar19;
          bVar41 = true;
        }
        else {
          bVar41 = false;
          local_110 = &local_90;
        }
      }
      else {
        *local_130 = uVar23;
        local_130 = puVar19;
        local_120 = (byte *)uVar15;
        if (uVar18 < uVar23) goto LAB_0019e611;
        bVar41 = false;
        local_130 = &local_90;
      }
    }
  } while (bVar41);
  *local_130 = 0;
  *local_110 = 0;
  ms->nextToUpdate = iVar39 - 8;
  return uVar14;
}

Assistant:

static size_t ZSTD_DUBT_findBestMatch (
                            ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                            const BYTE* const ip, const BYTE* const iend,
                            size_t* offsetPtr,
                            U32 const mls,
                            U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;   /* nullify next candidate if it's still unsorted (note : simplification, detrimental to compression ratio, beneficial for speed) */
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, cParams, matchIndex, iend,
                         nbCandidates, unsortLimit, extDict);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller=0, commonLengthLarger=0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current+8+1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}